

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::append_global_func_args
          (CompilerGLSL *this,SPIRFunction *func,uint32_t index,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arglist)

{
  uint32_t id;
  Parameter *pPVar1;
  size_t sVar2;
  SPIRVariable *pSVar3;
  ulong uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  uVar4 = (ulong)index;
  lVar5 = uVar4 * 0x14;
  while( true ) {
    if ((uint)sVar2 <= uVar4) {
      return;
    }
    pPVar1 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    if ((&pPVar1->alias_global_variable)[lVar5] == false) break;
    pSVar3 = Compiler::get<spirv_cross::SPIRVariable>
                       (&this->super_Compiler,*(uint32_t *)((long)&(pPVar1->id).id + lVar5));
    id = (pSVar3->basevariable).id;
    if (id != 0) {
      flush_variable_declaration(this,id);
    }
    (*(this->super_Compiler)._vptr_Compiler[0x1d])
              (&local_50,this,(long)&(pPVar1->type).id + lVar5,
               (ulong)*(uint *)((long)&(pPVar1->id).id + lVar5));
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arglist,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x14;
  }
  __assert_fail("arg.alias_global_variable",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x39c7,
                "void spirv_cross::CompilerGLSL::append_global_func_args(const SPIRFunction &, uint32_t, SmallVector<string> &)"
               );
}

Assistant:

void CompilerGLSL::append_global_func_args(const SPIRFunction &func, uint32_t index, SmallVector<string> &arglist)
{
	auto &args = func.arguments;
	uint32_t arg_cnt = uint32_t(args.size());
	for (uint32_t arg_idx = index; arg_idx < arg_cnt; arg_idx++)
	{
		auto &arg = args[arg_idx];
		assert(arg.alias_global_variable);

		// If the underlying variable needs to be declared
		// (ie. a local variable with deferred declaration), do so now.
		uint32_t var_id = get<SPIRVariable>(arg.id).basevariable;
		if (var_id)
			flush_variable_declaration(var_id);

		arglist.push_back(to_func_call_arg(arg, arg.id));
	}
}